

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_quicint(void)

{
  uint64_t uVar1;
  uint64_t decoded;
  uint8_t *src;
  uint8_t *enc_end;
  uint8_t buf [9];
  size_t i;
  uint8_t *p_13;
  uint8_t pat_13 [8];
  uint8_t *p_12;
  uint8_t pat_12 [8];
  uint8_t *p_11;
  uint8_t **ppuStack_b8;
  uint8_t pat_11 [4];
  uint8_t *p_10;
  uint8_t pat_10 [8];
  uint8_t *p_9;
  uint8_t *puStack_98;
  uint8_t pat_9 [4];
  uint8_t *p_8;
  uint8_t **ppuStack_88;
  uint8_t pat_8 [2];
  uint8_t *p_7;
  uint8_t pat_7 [8];
  uint8_t *p_6;
  uint8_t *puStack_68;
  uint8_t pat_6 [4];
  uint8_t *p_5;
  uint8_t *puStack_58;
  uint8_t pat_5 [2];
  uint8_t *p_4;
  uint8_t **ppuStack_48;
  uint8_t pat_4 [1];
  uint8_t *p_3;
  uint8_t pat_3 [8];
  uint8_t *p_2;
  uint8_t *puStack_28;
  uint8_t pat_2 [4];
  uint8_t *p_1;
  uint8_t *puStack_18;
  uint8_t pat_1 [2];
  uint8_t *p;
  uint8_t auStack_8 [7];
  uint8_t pat [1];
  
  memset((void *)((long)&p + 7),0,1);
  puStack_18 = (uint8_t *)((long)&p + 7);
  uVar1 = ptls_decode_quicint(&stack0xffffffffffffffe8,auStack_8);
  _ok((uint)(uVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5be)
  ;
  _ok((uint)(puStack_18 == auStack_8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5be)
  ;
  p_1._6_2_ = 0x40;
  puStack_28 = (uint8_t *)((long)&p_1 + 6);
  uVar1 = ptls_decode_quicint(&stack0xffffffffffffffd8,(uint8_t *)&stack0xffffffffffffffe8);
  _ok((uint)(uVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5bf)
  ;
  _ok((uint)((uint8_t **)puStack_28 == &stack0xffffffffffffffe8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5bf)
  ;
  p_2._4_4_ = 0x80;
  pat_3 = (uint8_t  [8])((long)&p_2 + 4);
  uVar1 = ptls_decode_quicint((uint8_t **)pat_3,(uint8_t *)&stack0xffffffffffffffd8);
  _ok((uint)(uVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c0)
  ;
  _ok((uint)(pat_3 == (uint8_t  [8])&stack0xffffffffffffffd8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c0)
  ;
  p_3 = (uint8_t *)0xc0;
  ppuStack_48 = &p_3;
  uVar1 = ptls_decode_quicint((uint8_t **)&stack0xffffffffffffffb8,pat_3);
  _ok((uint)(uVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c1)
  ;
  _ok((uint)(ppuStack_48 == (uint8_t **)pat_3),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c1)
  ;
  p_4._7_1_ = 9;
  puStack_58 = (uint8_t *)((long)&p_4 + 7);
  uVar1 = ptls_decode_quicint(&stack0xffffffffffffffa8,(uint8_t *)&stack0xffffffffffffffb8);
  _ok((uint)(uVar1 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c2)
  ;
  _ok((uint)((uint8_t ***)puStack_58 == &stack0xffffffffffffffb8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c2)
  ;
  p_5._6_2_ = 0x940;
  puStack_68 = (uint8_t *)((long)&p_5 + 6);
  uVar1 = ptls_decode_quicint(&stack0xffffffffffffff98,(uint8_t *)&stack0xffffffffffffffa8);
  _ok((uint)(uVar1 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c3)
  ;
  _ok((uint)((uint8_t **)puStack_68 == &stack0xffffffffffffffa8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c3)
  ;
  p_6._4_4_ = 0x9000080;
  pat_7 = (uint8_t  [8])((long)&p_6 + 4);
  uVar1 = ptls_decode_quicint((uint8_t **)pat_7,(uint8_t *)&stack0xffffffffffffff98);
  _ok((uint)(uVar1 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c4)
  ;
  _ok((uint)(pat_7 == (uint8_t  [8])&stack0xffffffffffffff98),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c4)
  ;
  p_7 = (uint8_t *)0x9000000000000c0;
  ppuStack_88 = &p_7;
  uVar1 = ptls_decode_quicint((uint8_t **)&stack0xffffffffffffff78,pat_7);
  _ok((uint)(uVar1 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c5)
  ;
  _ok((uint)(ppuStack_88 == (uint8_t **)pat_7),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c5)
  ;
  p_8._6_2_ = 0x3452;
  puStack_98 = (uint8_t *)((long)&p_8 + 6);
  uVar1 = ptls_decode_quicint(&stack0xffffffffffffff68,(uint8_t *)&stack0xffffffffffffff78);
  _ok((uint)(uVar1 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c6)
  ;
  _ok((uint)((uint8_t ***)puStack_98 == &stack0xffffffffffffff78),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c6)
  ;
  p_9._4_4_ = 0x34120080;
  pat_10 = (uint8_t  [8])((long)&p_9 + 4);
  uVar1 = ptls_decode_quicint((uint8_t **)pat_10,(uint8_t *)&stack0xffffffffffffff68);
  _ok((uint)(uVar1 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c7)
  ;
  _ok((uint)(pat_10 == (uint8_t  [8])&stack0xffffffffffffff68),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c7)
  ;
  p_10 = (uint8_t *)0x34120000000000c0;
  ppuStack_b8 = &p_10;
  uVar1 = ptls_decode_quicint((uint8_t **)&stack0xffffffffffffff48,pat_10);
  _ok((uint)(uVar1 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c8)
  ;
  _ok((uint)(ppuStack_b8 == (uint8_t **)pat_10),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c8)
  ;
  p_11._4_4_ = 0x78563492;
  pat_12 = (uint8_t  [8])((long)&p_11 + 4);
  uVar1 = ptls_decode_quicint((uint8_t **)pat_12,(uint8_t *)&stack0xffffffffffffff48);
  _ok((uint)(uVar1 == 0x12345678),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c9)
  ;
  _ok((uint)(pat_12 == (uint8_t  [8])&stack0xffffffffffffff48),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c9)
  ;
  p_12 = (uint8_t *)0x78563412000000c0;
  pat_13 = (uint8_t  [8])&p_12;
  uVar1 = ptls_decode_quicint((uint8_t **)pat_13,pat_12);
  _ok((uint)(uVar1 == 0x12345678),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5ca)
  ;
  _ok((uint)(pat_13 == (uint8_t  [8])pat_12),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5ca)
  ;
  p_13 = (uint8_t *)0xefcdab89674523c1;
  i = (size_t)&p_13;
  uVar1 = ptls_decode_quicint((uint8_t **)&i,pat_13);
  _ok((uint)(uVar1 == 0x123456789abcdef),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5cb)
  ;
  _ok((uint)((uint8_t *)i == pat_13),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5cb)
  ;
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  while( true ) {
    if (test_quicint::inputs[buf._1_8_] == 0xffffffffffffffff) {
      return;
    }
    memset((void *)((long)&enc_end + 7),0x7b,9);
    src = ptls_encode_quicint((uint8_t *)((long)&enc_end + 7),test_quicint::inputs[buf._1_8_]);
    if (8 < (long)src - ((long)&enc_end + 7)) break;
    decoded = (long)&enc_end + 7;
    uVar1 = ptls_decode_quicint((uint8_t **)&decoded,buf + 1);
    _ok((uint)(test_quicint::inputs[buf._1_8_] == uVar1),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5d8);
    _ok((uint)((uint8_t *)decoded == src),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5d9);
    _ok((uint)(*(char *)decoded == '{'),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5da);
    buf._1_8_ = buf._1_8_ + 1;
  }
  __assert_fail("enc_end - buf <= PTLS_ENCODE_QUICINT_CAPACITY",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0x5d5,"void test_quicint(void)");
}

Assistant:

static void test_quicint(void)
{
#define CHECK_PATTERN(output, ...)                                                                                                 \
    do {                                                                                                                           \
        const uint8_t pat[] = {__VA_ARGS__}, *p = pat;                                                                             \
        ok(output == ptls_decode_quicint(&p, pat + sizeof(pat)));                                                                  \
        ok(p == pat + sizeof(pat));                                                                                                \
    } while (0)
    CHECK_PATTERN(0, 0);
    CHECK_PATTERN(0, 0x40, 0);
    CHECK_PATTERN(0, 0x80, 0, 0, 0);
    CHECK_PATTERN(0, 0xc0, 0, 0, 0, 0, 0, 0, 0);
    CHECK_PATTERN(9, 9);
    CHECK_PATTERN(9, 0x40, 9);
    CHECK_PATTERN(9, 0x80, 0, 0, 9);
    CHECK_PATTERN(9, 0xc0, 0, 0, 0, 0, 0, 0, 9);
    CHECK_PATTERN(0x1234, 0x52, 0x34);
    CHECK_PATTERN(0x1234, 0x80, 0, 0x12, 0x34);
    CHECK_PATTERN(0x1234, 0xc0, 0, 0, 0, 0, 0, 0x12, 0x34);
    CHECK_PATTERN(0x12345678, 0x92, 0x34, 0x56, 0x78);
    CHECK_PATTERN(0x12345678, 0xc0, 0, 0, 0, 0x12, 0x34, 0x56, 0x78);
    CHECK_PATTERN(0x123456789abcdef, 0xc1, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef);
#undef CHECK_PATTERN

    static uint64_t inputs[] = {0, 1, 63, 64, 16383, 16384, 1073741823, 1073741824, UINT64_MAX};
    size_t i;

    for (i = 0; inputs[i] != UINT64_MAX; ++i) {
        uint8_t buf[PTLS_ENCODE_QUICINT_CAPACITY + 1];
        memset(buf, 123, sizeof(buf));
        uint8_t *enc_end = ptls_encode_quicint(buf, inputs[i]);
        assert(enc_end - buf <= PTLS_ENCODE_QUICINT_CAPACITY);
        const uint8_t *src = buf;
        uint64_t decoded = ptls_decode_quicint(&src, buf + sizeof(buf));
        ok(inputs[i] == decoded);
        ok(src == enc_end);
        ok(*src == 123);
    }
}